

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
          *samples)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pRVar3;
  pointer pfVar4;
  undefined8 uVar5;
  pointer pVVar6;
  deUint64 *pdVar7;
  int *piVar8;
  pointer pRVar9;
  SampleBuilder *pSVar10;
  uint uVar11;
  ulong target;
  long lVar12;
  int endNdx;
  long lVar13;
  size_type __n;
  ulong uVar14;
  pointer pfVar15;
  undefined1 auVar16 [8];
  undefined1 auVar17 [8];
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  RenderSampleAnalyzeResult RVar24;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_type __dnew;
  LineParametersWithConfidence contributionFitting;
  ScopedLogSection section_1;
  LineParametersWithConfidence theilSenFitting;
  size_type __dnew_3;
  size_type __dnew_4;
  ScopedLogSection section;
  ScopedLogSection section_2;
  undefined1 local_a78 [12];
  float fStack_a6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a68;
  string local_a58;
  string local_a38;
  qpSampleValueTag local_a18;
  float local_a14;
  undefined1 local_a10 [8];
  undefined8 local_a08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a00;
  string local_9f0;
  string local_9d0;
  qpSampleValueTag local_9b0;
  float local_9ac;
  float local_9a4;
  float local_9a0;
  float local_99c;
  LogNumber<float> local_998;
  undefined1 local_930 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_920;
  float local_910;
  float local_90c;
  string local_908;
  LogNumber<float> local_8e8;
  LogNumber<float> local_880;
  LineParametersWithConfidence local_814;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  LogNumber<float> local_6b8;
  LogNumber<float> local_650;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  float local_588;
  float local_584;
  float local_580;
  float local_57c;
  float local_578;
  float local_574;
  float local_570;
  float local_56c;
  float local_568;
  float local_564;
  LogNumber<float> local_560;
  LogNumber<float> local_4f8;
  LogNumber<float> local_490;
  LogNumber<float> local_428;
  LogNumber<float> local_3c0;
  undefined1 local_358 [16];
  string local_340;
  ScopedLogSection local_320;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            (&local_814,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a10,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)local_a78);
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = ((long)(samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) * 0x6db6db6db6db6db7
  ;
  uVar11 = (uint)__n;
  if (0 < (int)uVar11) {
    pdVar7 = &(pRVar9->duration).fitResponseDuration;
    uVar14 = 0;
    do {
      *(deUint64 *)((long)local_a10 + uVar14 * 8) = *pdVar7;
      uVar14 = uVar14 + 1;
      pdVar7 = pdVar7 + 7;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,__n,(allocator_type *)&local_998);
  uVar5 = local_a78._0_8_;
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pRVar9->renderDataSize;
    uVar14 = 0;
    do {
      *(float *)(local_a78._0_8_ + uVar14 * 4) =
           (float)*piVar8 / (((float)*(ulong *)((long)local_a10 + uVar14 * 8) / 1000.0) / 1000.0);
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  pfVar15 = (pointer)local_a78._0_8_;
  if ((pointer)local_a78._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_a78._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
    pfVar15 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  }
  uVar5 = local_a78._0_8_;
  local_99c = (float)(((long)pfVar15 - local_a78._0_8_ >> 2) - 1) * 0.5;
  fVar19 = floorf(local_99c);
  fVar20 = local_99c - (float)(int)fVar19;
  local_99c = fVar20 * *(float *)(uVar5 + (long)((int)fVar19 + 1) * 4);
  local_148 = ZEXT416((uint)((1.0 - fVar20) * *(float *)(uVar5 + (long)(int)fVar19 * 4)));
  operator_delete((void *)uVar5,local_a68._M_allocated_capacity - uVar5);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)&local_998);
  uVar5 = local_a78._0_8_;
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pRVar9->renderDataSize;
    uVar14 = 0;
    do {
      *(float *)(local_a78._0_8_ + uVar14 * 4) =
           (float)*(ulong *)((long)local_a10 + uVar14 * 8) -
           ((float)*piVar8 * local_814.coefficient + local_814.offset);
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  if ((pointer)local_a78._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_a78._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity - local_a78._0_8_);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)&local_998);
  uVar5 = local_a78._0_8_;
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pRVar9->renderDataSize;
    uVar14 = 0;
    do {
      fVar19 = (float)*piVar8 * local_814.coefficient + local_814.offset;
      fVar20 = 0.0;
      if (1.0 <= fVar19) {
        fVar20 = ((float)*(ulong *)((long)local_a10 + uVar14 * 8) - fVar19) / fVar19;
      }
      *(float *)(local_a78._0_8_ + uVar14 * 4) = fVar20;
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  if ((pointer)local_a78._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_a78._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity - local_a78._0_8_);
  pVVar6 = local_a08;
  auVar16 = local_a10;
  auVar17 = local_a10;
  if (local_a10 != (undefined1  [8])local_a08) {
    uVar14 = (long)local_a08 - (long)local_a10 >> 3;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a10,local_a08,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar16,pVVar6);
    auVar16 = (undefined1  [8])local_a08;
    auVar17 = local_a10;
  }
  local_564 = (float)(((long)auVar16 - (long)auVar17 >> 3) - 1) * 0.5;
  local_48 = floorf(local_564);
  uVar14 = *(ulong *)((long)auVar17 + (long)(int)local_48 * 8);
  target = uVar14;
  if ((long)uVar14 < 0) {
    target = (ulong)((uint)uVar14 & 1) | uVar14 >> 1;
  }
  local_90c = (float)uVar14;
  uVar14 = *(ulong *)((long)auVar17 + (long)((int)local_48 + 1) * 8);
  if ((long)uVar14 < 0) {
    target = uVar14 >> 1;
  }
  local_910 = (float)uVar14;
  operator_delete((void *)auVar17,aStack_a00._M_allocated_capacity - (long)auVar17);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x0,target);
  local_9a0 = (float)local_a08;
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x8,target);
  local_158._0_4_ = (float)local_a08;
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x18,target);
  local_9a4 = (float)local_a08;
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Samples","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_340,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  local_428.m_name._M_dataplus._M_p = (pointer)&local_428.m_name.field_2;
  local_428.m_name._M_string_length = 7;
  local_428.m_name.field_2._M_allocated_capacity = 0x73656c706d6153;
  local_3c0.m_name._M_dataplus._M_p = (pointer)&local_3c0.m_name.field_2;
  local_3c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_3c0.m_name._M_string_length = 7;
  local_3c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_8e8,&local_428.m_name,&local_3c0.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_8e8.m_name,&local_8e8.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_880.m_name._M_dataplus._M_p = (pointer)&local_880.m_name.field_2;
  local_880.m_name.field_2._M_allocated_capacity._0_6_ = 0x695361746144;
  local_880.m_name.field_2._M_local_buf[6] = 'z';
  local_880.m_name.field_2._M_local_buf[7] = 'e';
  local_880.m_name._M_string_length = 8;
  local_880.m_name.field_2._M_local_buf[8] = '\0';
  local_4f8.m_name._M_dataplus._M_p = (pointer)&local_4f8.m_name.field_2;
  local_4f8.m_name.field_2._M_allocated_capacity._0_6_ = 0x702061746144;
  local_4f8.m_name.field_2._M_allocated_capacity._6_2_ = 0x6f72;
  local_4f8.m_name.field_2._8_6_ = 0x646573736563;
  local_4f8.m_name._M_string_length = 0xe;
  local_4f8.m_name.field_2._M_local_buf[0xe] = '\0';
  local_490.m_name._M_dataplus._M_p = (pointer)&local_490.m_name.field_2;
  local_490.m_name.field_2._M_allocated_capacity._0_2_ = 0x7962;
  local_490.m_name.field_2._M_local_buf[2] = 't';
  local_490.m_name.field_2._M_local_buf[3] = 'e';
  local_490.m_name.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_490.m_name._M_string_length = 5;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a10,&local_880.m_name,&local_4f8.m_name,&local_490.m_name,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a10,&local_9f0,&local_9d0,local_9b0);
  local_930._0_8_ = &local_920;
  local_920._M_allocated_capacity._0_7_ = 0x43786574726556;
  local_920._7_4_ = 0x746e756f;
  local_930._8_8_ = 0xb;
  local_920._M_local_buf[0xb] = '\0';
  local_998.m_name._M_dataplus._M_p = (pointer)0x12;
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  local_908._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_908,(ulong)&local_998);
  local_908.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  *(undefined8 *)local_908._M_dataplus._M_p = 0x6f207265626d754e;
  *(undefined8 *)((long)local_908._M_dataplus._M_p + 8) = 0x6369747265762066;
  *(undefined2 *)((long)local_908._M_dataplus._M_p + 0x10) = 0x7365;
  local_908._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_998.m_name._M_dataplus._M_p[(long)local_908._M_dataplus._M_p] = '\0';
  local_5a8.field_2._M_allocated_capacity = 0x7365636974726576;
  local_5a8._M_string_length = 8;
  local_5a8.field_2._M_local_buf[8] = '\0';
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a78,(string *)local_930,&local_908,&local_5a8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a78,&local_a58,&local_a38,local_a18);
  local_5c8.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_5c8.field_2._8_2_ = 0x65;
  local_5c8._M_string_length = 9;
  local_5e8.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_5e8.field_2._8_2_ = 0x656d;
  local_5e8._M_string_length = 10;
  local_5e8.field_2._M_local_buf[10] = '\0';
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  local_6d8.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6d8._M_string_length = 2;
  local_6d8.field_2._M_local_buf[2] = '\0';
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_998,&local_5c8,&local_5e8,&local_6d8,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_998.m_name,&local_998.m_desc,&local_998.m_unit,local_998.m_tag);
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  local_6f8.field_2._M_allocated_capacity = 0x6c6c614377617244;
  local_6f8.field_2._8_4_ = 0x656d6954;
  local_6f8._M_string_length = 0xc;
  local_6f8.field_2._M_local_buf[0xc] = '\0';
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  local_718.field_2._M_allocated_capacity._0_6_ = 0x632077617244;
  local_718.field_2._M_allocated_capacity._6_2_ = 0x6c61;
  local_718.field_2._8_6_ = 0x656d6974206c;
  local_718._M_string_length = 0xe;
  local_718.field_2._M_local_buf[0xe] = '\0';
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  local_738.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_738._M_string_length = 2;
  local_738.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_650,&local_6f8,&local_718,&local_738,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_650.m_name,&local_650.m_desc,&local_650.m_unit,local_650.m_tag);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  local_758.field_2._M_allocated_capacity = 0x656d695464616552;
  local_758._M_string_length = 8;
  local_758.field_2._M_local_buf[8] = '\0';
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  local_778.field_2._M_allocated_capacity._0_7_ = 0x78695064616552;
  local_778.field_2._M_local_buf[7] = 'e';
  local_778.field_2._8_7_ = 0x656d697420736c;
  local_778._M_string_length = 0xf;
  local_778.field_2._M_local_buf[0xf] = '\0';
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  local_798.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_798._M_string_length = 2;
  local_798.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_6b8,&local_758,&local_778,&local_798,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_6b8.m_name,&local_6b8.m_desc,&local_6b8.m_unit,local_6b8.m_tag);
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  local_7b8.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_7b8.field_2._7_4_ = 0x6c617564;
  local_7b8._M_string_length = 0xb;
  local_7b8.field_2._M_local_buf[0xb] = '\0';
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  local_7d8.field_2._M_allocated_capacity = 0x6973657220746946;
  local_7d8.field_2._8_4_ = 0x6c617564;
  local_7d8._M_string_length = 0xc;
  local_7d8.field_2._M_local_buf[0xc] = '\0';
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  local_7f8.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_7f8._M_string_length = 2;
  local_7f8.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_560,&local_7b8,&local_7d8,&local_7f8,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_560.m_name,&local_560.m_desc,&local_560.m_unit,local_560.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_unit._M_dataplus._M_p != &local_560.m_unit.field_2) {
    operator_delete(local_560.m_unit._M_dataplus._M_p,
                    local_560.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_desc._M_dataplus._M_p != &local_560.m_desc.field_2) {
    operator_delete(local_560.m_desc._M_dataplus._M_p,
                    local_560.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_name._M_dataplus._M_p != &local_560.m_name.field_2) {
    operator_delete(local_560.m_name._M_dataplus._M_p,
                    CONCAT53(local_560.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_560.m_name.field_2._M_local_buf[2],
                                      local_560.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,
                    CONCAT53(local_7f8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_7f8.field_2._M_local_buf[2],
                                      local_7f8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,
                    CONCAT17(local_7b8.field_2._M_local_buf[7],
                             local_7b8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_unit._M_dataplus._M_p != &local_6b8.m_unit.field_2) {
    operator_delete(local_6b8.m_unit._M_dataplus._M_p,
                    local_6b8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_desc._M_dataplus._M_p != &local_6b8.m_desc.field_2) {
    operator_delete(local_6b8.m_desc._M_dataplus._M_p,
                    local_6b8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_name._M_dataplus._M_p != &local_6b8.m_name.field_2) {
    operator_delete(local_6b8.m_name._M_dataplus._M_p,
                    local_6b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,
                    CONCAT53(local_798.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_798.field_2._M_local_buf[2],
                                      local_798.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,
                    CONCAT17(local_778.field_2._M_local_buf[7],
                             local_778.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_unit._M_dataplus._M_p != &local_650.m_unit.field_2) {
    operator_delete(local_650.m_unit._M_dataplus._M_p,
                    local_650.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_desc._M_dataplus._M_p != &local_650.m_desc.field_2) {
    operator_delete(local_650.m_desc._M_dataplus._M_p,
                    local_650.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_name._M_dataplus._M_p != &local_650.m_name.field_2) {
    operator_delete(local_650.m_name._M_dataplus._M_p,
                    local_650.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,
                    CONCAT53(local_738.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_738.field_2._M_local_buf[2],
                                      local_738.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,
                    CONCAT26(local_718.field_2._M_allocated_capacity._6_2_,
                             local_718.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,
                    CONCAT53(local_6d8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6d8.field_2._M_local_buf[2],
                                      local_6d8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,(ulong)(local_908.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._0_8_ != &local_920) {
    operator_delete((void *)local_930._0_8_,
                    CONCAT17(local_920._M_local_buf[7],local_920._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.m_name._M_dataplus._M_p != &local_490.m_name.field_2) {
    operator_delete(local_490.m_name._M_dataplus._M_p,
                    CONCAT26(local_490.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_490.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_490.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_490.m_name.field_2._M_local_buf[2],
                                                        local_490.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_name._M_dataplus._M_p != &local_4f8.m_name.field_2) {
    operator_delete(local_4f8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4f8.m_name.field_2._M_allocated_capacity._6_2_,
                             local_4f8.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_880.m_name.field_2._M_local_buf[6],
                                      local_880.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_desc._M_dataplus._M_p != &local_8e8.m_desc.field_2) {
    operator_delete(local_8e8.m_desc._M_dataplus._M_p,
                    local_8e8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_name._M_dataplus._M_p != &local_8e8.m_name.field_2) {
    operator_delete(local_8e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8e8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8e8.m_name.field_2._M_local_buf[6],
                                      local_8e8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_name._M_dataplus._M_p != &local_3c0.m_name.field_2) {
    operator_delete(local_3c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.m_name._M_dataplus._M_p != &local_428.m_name.field_2) {
    operator_delete(local_428.m_name._M_dataplus._M_p,
                    local_428.m_name.field_2._M_allocated_capacity + 1);
  }
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9) >> 3) *
          -0x49249249) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      uVar14 = *(ulong *)((long)&(pRVar9->duration).fitResponseDuration + lVar13);
      local_358._0_4_ =
           (float)*(int *)((long)&pRVar9->renderDataSize + lVar13) * local_814.coefficient +
           local_814.offset;
      local_a08 = (pointer)0x0;
      aStack_a00._M_allocated_capacity = 0;
      aStack_a00._8_8_ = 0;
      local_a10 = (undefined1  [8])log;
      pSVar10 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_a10,
                           *(int *)((long)&pRVar9->renderDataSize + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&((samples->
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  numVertices + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).renderReadDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).renderDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).readDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<(pSVar10,(float)uVar14 - (float)local_358._0_4_);
      tcu::SampleBuilder::operator<<(pSVar10,(EndSampleToken *)&tcu::TestLog::EndSample);
      if (local_a08 != (pointer)0x0) {
        operator_delete(local_a08,aStack_a00._8_8_ - (long)local_a08);
      }
      lVar12 = lVar12 + 1;
      pRVar9 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x38;
    } while (lVar12 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9
                                   ) >> 3) * -0x49249249);
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_340._M_dataplus._M_p);
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Contribution","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Contributions","");
  paVar1 = &local_428.m_name.field_2;
  paVar2 = &local_3c0.m_name.field_2;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_908,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,0)
  ;
  local_650.m_name._M_dataplus._M_p = (pointer)&local_650.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"DrawCallConstantCost","");
  local_6b8.m_name._M_dataplus._M_p = (pointer)&local_6b8.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,"DrawCall: Approximated contant cost","");
  local_560.m_name._M_dataplus._M_p = (pointer)&local_560.m_name.field_2;
  local_560.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_560.m_name._M_string_length = 2;
  local_560.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_650.m_name,&local_6b8.m_name,&local_560.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_8e8.m_name._M_dataplus._M_p = (pointer)&local_8e8.m_name.field_2;
  local_998.m_name._M_dataplus._M_p = (pointer)0x12;
  local_8e8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_8e8,(ulong)&local_998);
  local_8e8.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_998.m_name._M_dataplus._M_p,0);
  local_8e8.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_998.m_name._M_dataplus._M_p >> 0x30);
  local_8e8.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_998.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_8e8.m_name._M_dataplus._M_p,"DrawCallLinearCost",0x12);
  local_8e8.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_8e8.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_998.m_name._M_dataplus._M_p = (char *)0x22;
  local_428.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_428.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_428,(ulong)&local_998);
  local_428.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_428.m_name._M_dataplus._M_p,"DrawCall: Approximated linear cost",0x22);
  local_428.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_428.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_3c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_3c0.m_name._M_string_length = 7;
  local_3c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_3c0.m_name._M_dataplus._M_p = (pointer)paVar2;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_8e8.m_name,&local_428.m_name,&local_3c0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_880.m_name._M_dataplus._M_p = (pointer)&local_880.m_name.field_2;
  local_4f8.m_name._M_dataplus._M_p = (pointer)0x12;
  local_880.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_880,(ulong)&local_4f8);
  local_880.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_4f8.m_name._M_dataplus._M_p,0);
  local_880.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_4f8.m_name._M_dataplus._M_p >> 0x30);
  local_880.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_4f8.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_880.m_name._M_dataplus._M_p,"DrawCallMedianCost",0x12);
  local_880.m_name._M_string_length = (size_type)local_4f8.m_name._M_dataplus._M_p;
  local_880.m_name._M_dataplus._M_p[(long)local_4f8.m_name._M_dataplus._M_p] = '\0';
  local_4f8.m_name._M_dataplus._M_p = (pointer)&local_4f8.m_name.field_2;
  local_490.m_name._M_dataplus._M_p = (pointer)0x15;
  local_4f8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&local_490);
  local_4f8.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_490.m_name._M_dataplus._M_p,0);
  local_4f8.m_name.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_490.m_name._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_4f8.m_name._M_dataplus._M_p,"DrawCall: Median cost",0x15);
  local_4f8.m_name._M_string_length = (size_type)local_490.m_name._M_dataplus._M_p;
  local_4f8.m_name._M_dataplus._M_p[(long)local_490.m_name._M_dataplus._M_p] = '\0';
  local_490.m_name._M_dataplus._M_p = (pointer)&local_490.m_name.field_2;
  local_490.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_490.m_name._M_string_length = 2;
  local_490.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_880.m_name,&local_4f8.m_name,&local_490.m_name,QP_KEY_TAG_TIME,
             local_9a0);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.m_name._M_dataplus._M_p != &local_490.m_name.field_2) {
    operator_delete(local_490.m_name._M_dataplus._M_p,
                    CONCAT26(local_490.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_490.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_490.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_490.m_name.field_2._M_local_buf[2],
                                                        local_490.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_name._M_dataplus._M_p != &local_4f8.m_name.field_2) {
    operator_delete(local_4f8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4f8.m_name.field_2._M_allocated_capacity._6_2_,
                             local_4f8.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_880.m_name.field_2._M_local_buf[6],
                                      local_880.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_428.m_name._M_dataplus._M_p,
                    (ulong)(local_428.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_name._M_dataplus._M_p != &local_8e8.m_name.field_2) {
    operator_delete(local_8e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8e8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8e8.m_name.field_2._M_local_buf[6],
                                      local_8e8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_name._M_dataplus._M_p != &local_560.m_name.field_2) {
    operator_delete(local_560.m_name._M_dataplus._M_p,
                    CONCAT53(local_560.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_560.m_name.field_2._M_local_buf[2],
                                      local_560.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_name._M_dataplus._M_p != &local_6b8.m_name.field_2) {
    operator_delete(local_6b8.m_name._M_dataplus._M_p,
                    local_6b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_name._M_dataplus._M_p != &local_650.m_name.field_2) {
    operator_delete(local_650.m_name._M_dataplus._M_p,
                    local_650.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,8)
  ;
  local_650.m_name._M_dataplus._M_p = (pointer)&local_650.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"ReadConstantCost","");
  local_6b8.m_name._M_dataplus._M_p = (pointer)&local_6b8.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,"Read: Approximated contant cost","");
  local_560.m_name._M_dataplus._M_p = (pointer)&local_560.m_name.field_2;
  local_560.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_560.m_name._M_string_length = 2;
  local_560.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_650.m_name,&local_6b8.m_name,&local_560.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_8e8.m_name._M_dataplus._M_p = (pointer)&local_8e8.m_name.field_2;
  local_8e8.m_name.field_2._M_allocated_capacity._0_6_ = 0x694c64616552;
  local_8e8.m_name.field_2._M_local_buf[6] = 'n';
  local_8e8.m_name.field_2._M_local_buf[7] = 'e';
  local_8e8.m_name.field_2._8_6_ = 0x74736f437261;
  local_8e8.m_name._M_string_length = 0xe;
  local_8e8.m_name.field_2._M_local_buf[0xe] = '\0';
  local_998.m_name._M_dataplus._M_p = (char *)0x1e;
  local_428.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_428.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_428,(ulong)&local_998);
  local_428.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_428.m_name._M_dataplus._M_p,"Read: Approximated linear cost",0x1e);
  local_428.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_428.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_3c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_3c0.m_name._M_string_length = 7;
  local_3c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_3c0.m_name._M_dataplus._M_p = (pointer)paVar2;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_8e8.m_name,&local_428.m_name,&local_3c0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_880.m_name._M_dataplus._M_p = (pointer)&local_880.m_name.field_2;
  local_880.m_name.field_2._M_allocated_capacity._0_6_ = 0x654d64616552;
  local_880.m_name.field_2._M_local_buf[6] = 'd';
  local_880.m_name.field_2._M_local_buf[7] = 'i';
  local_880.m_name.field_2._M_local_buf[8] = 'a';
  local_880.m_name.field_2._9_5_ = 0x74736f436e;
  local_880.m_name._M_string_length = 0xe;
  local_880.m_name.field_2._M_local_buf[0xe] = '\0';
  local_4f8.m_name._M_dataplus._M_p = (pointer)&local_4f8.m_name.field_2;
  local_490.m_name._M_dataplus._M_p = (pointer)0x11;
  local_4f8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&local_490);
  local_4f8.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_490.m_name._M_dataplus._M_p,0);
  local_4f8.m_name.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_490.m_name._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_4f8.m_name._M_dataplus._M_p,"Read: Median cost",0x11);
  local_4f8.m_name._M_string_length = (size_type)local_490.m_name._M_dataplus._M_p;
  local_4f8.m_name._M_dataplus._M_p[(long)local_490.m_name._M_dataplus._M_p] = '\0';
  local_490.m_name._M_dataplus._M_p = (pointer)&local_490.m_name.field_2;
  local_490.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_490.m_name._M_string_length = 2;
  local_490.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_880.m_name,&local_4f8.m_name,&local_490.m_name,QP_KEY_TAG_TIME,
             (float)local_158._0_4_);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.m_name._M_dataplus._M_p != &local_490.m_name.field_2) {
    operator_delete(local_490.m_name._M_dataplus._M_p,
                    CONCAT26(local_490.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_490.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_490.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_490.m_name.field_2._M_local_buf[2],
                                                        local_490.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_name._M_dataplus._M_p != &local_4f8.m_name.field_2) {
    operator_delete(local_4f8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4f8.m_name.field_2._M_allocated_capacity._6_2_,
                             local_4f8.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_880.m_name.field_2._M_local_buf[6],
                                      local_880.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_428.m_name._M_dataplus._M_p,
                    (ulong)(local_428.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_name._M_dataplus._M_p != &local_8e8.m_name.field_2) {
    operator_delete(local_8e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8e8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8e8.m_name.field_2._M_local_buf[6],
                                      local_8e8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_name._M_dataplus._M_p != &local_560.m_name.field_2) {
    operator_delete(local_560.m_name._M_dataplus._M_p,
                    CONCAT53(local_560.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_560.m_name.field_2._M_local_buf[2],
                                      local_560.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_name._M_dataplus._M_p != &local_6b8.m_name.field_2) {
    operator_delete(local_6b8.m_name._M_dataplus._M_p,
                    local_6b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_name._M_dataplus._M_p != &local_650.m_name.field_2) {
    operator_delete(local_650.m_name._M_dataplus._M_p,
                    local_650.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x18);
  local_650.m_name._M_dataplus._M_p = (pointer)&local_650.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"TotalConstantCost","");
  local_6b8.m_name._M_dataplus._M_p = (pointer)&local_6b8.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,"Total: Approximated contant cost","");
  local_560.m_name._M_dataplus._M_p = (pointer)&local_560.m_name.field_2;
  local_560.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_560.m_name._M_string_length = 2;
  local_560.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_650.m_name,&local_6b8.m_name,&local_560.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_8e8.m_name._M_dataplus._M_p = (pointer)&local_8e8.m_name.field_2;
  local_8e8.m_name.field_2._M_allocated_capacity._0_6_ = 0x4c6c61746f54;
  local_8e8.m_name.field_2._M_local_buf[6] = 'i';
  local_8e8.m_name.field_2._M_local_buf[7] = 'n';
  local_8e8.m_name.field_2._8_6_ = 0x736f43726165;
  local_8e8.m_name.field_2._M_local_buf[0xe] = 't';
  local_8e8.m_name._M_string_length = 0xf;
  local_8e8.m_name.field_2._M_local_buf[0xf] = '\0';
  local_998.m_name._M_dataplus._M_p = (char *)0x1f;
  local_428.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_428.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_428,(ulong)&local_998);
  local_428.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_428.m_name._M_dataplus._M_p,"Total: Approximated linear cost",0x1f);
  local_428.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_428.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_3c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_3c0.m_name._M_string_length = 7;
  local_3c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_3c0.m_name._M_dataplus._M_p = (pointer)paVar2;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_8e8.m_name,&local_428.m_name,&local_3c0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_880.m_name._M_dataplus._M_p = (pointer)&local_880.m_name.field_2;
  local_880.m_name.field_2._M_allocated_capacity._0_6_ = 0x4d6c61746f54;
  local_880.m_name.field_2._M_local_buf[6] = 'e';
  local_880.m_name.field_2._M_local_buf[7] = 'd';
  local_880.m_name.field_2._M_local_buf[8] = 'i';
  local_880.m_name.field_2._9_5_ = 0x736f436e61;
  local_880.m_name.field_2._M_local_buf[0xe] = 't';
  local_880.m_name._M_string_length = 0xf;
  local_880.m_name.field_2._M_local_buf[0xf] = '\0';
  local_4f8.m_name._M_dataplus._M_p = (pointer)&local_4f8.m_name.field_2;
  local_490.m_name._M_dataplus._M_p = (pointer)0x12;
  local_4f8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&local_490);
  local_4f8.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_490.m_name._M_dataplus._M_p,0);
  local_4f8.m_name.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_490.m_name._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_4f8.m_name._M_dataplus._M_p,"Total: Median cost",0x12);
  local_4f8.m_name._M_string_length = (size_type)local_490.m_name._M_dataplus._M_p;
  local_4f8.m_name._M_dataplus._M_p[(long)local_490.m_name._M_dataplus._M_p] = '\0';
  local_490.m_name._M_dataplus._M_p = (pointer)&local_490.m_name.field_2;
  local_490.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_490.m_name._M_string_length = 2;
  local_490.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_880.m_name,&local_4f8.m_name,&local_490.m_name,QP_KEY_TAG_TIME,
             local_9a4);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.m_name._M_dataplus._M_p != &local_490.m_name.field_2) {
    operator_delete(local_490.m_name._M_dataplus._M_p,
                    CONCAT26(local_490.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_490.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_490.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_490.m_name.field_2._M_local_buf[2],
                                                        local_490.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_name._M_dataplus._M_p != &local_4f8.m_name.field_2) {
    operator_delete(local_4f8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4f8.m_name.field_2._M_allocated_capacity._6_2_,
                             local_4f8.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_880.m_name.field_2._M_local_buf[6],
                                      local_880.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_428.m_name._M_dataplus._M_p,
                    (ulong)(local_428.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_name._M_dataplus._M_p != &local_8e8.m_name.field_2) {
    operator_delete(local_8e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8e8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8e8.m_name.field_2._M_local_buf[6],
                                      local_8e8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_name._M_dataplus._M_p != &local_560.m_name.field_2) {
    operator_delete(local_560.m_name._M_dataplus._M_p,
                    CONCAT53(local_560.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_560.m_name.field_2._M_local_buf[2],
                                      local_560.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_name._M_dataplus._M_p != &local_6b8.m_name.field_2) {
    operator_delete(local_6b8.m_name._M_dataplus._M_p,
                    local_6b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_name._M_dataplus._M_p != &local_650.m_name.field_2) {
    operator_delete(local_650.m_name._M_dataplus._M_p,
                    local_650.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_908._M_dataplus._M_p);
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Results","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Results","");
  tcu::ScopedLogSection::ScopedLogSection(&local_320,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar20 = (float)((pRVar3[-1].renderDataSize + pRVar9->renderDataSize) / 2);
  local_588 = local_814.coefficient * fVar20;
  local_584 = local_814.offset + local_588;
  endNdx = ((int)((ulong)((long)pRVar3 - (long)pRVar9) >> 3) * -0x49249249) / 2;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_a10,samples,0,endNdx,1,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_a78,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x20);
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar19 = (float)pRVar9->renderDataSize;
  local_9a0 = (float)pRVar3[-1].renderDataSize;
  local_358._0_4_ = fVar19;
  local_56c = (float)local_a10._0_4_;
  local_158 = ZEXT416((uint)local_a08._4_4_);
  local_568 = (float)local_a78._0_4_;
  local_58 = ZEXT416((uint)fStack_a6c);
  local_9a4 = getAreaBetweenLines(fVar19,local_9a0,(float)local_a10._0_4_,local_a08._4_4_,
                                  (float)local_a78._0_4_,fStack_a6c);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_a10,samples,0,
             (int)((ulong)((long)pRVar3 - (long)pRVar9) >> 3) * -0x49249249,2,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_a78,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,2,
             0x20);
  local_570 = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  local_574 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  local_580 = (float)local_a10._0_4_;
  local_68 = ZEXT416((uint)local_a08._4_4_);
  local_57c = (float)local_a78._0_4_;
  local_78 = ZEXT416((uint)fStack_a6c);
  local_578 = getAreaBetweenLines(local_570,local_574,(float)local_a10._0_4_,local_a08._4_4_,
                                  (float)local_a78._0_4_,fStack_a6c);
  local_930._0_8_ = &local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_930,"ResultLinearity","");
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Sample linearity","");
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"%","");
  fVar19 = (float)local_158._0_4_ * (float)local_358._0_4_ + local_56c;
  fVar21 = (float)local_58._0_4_ * (float)local_358._0_4_ + local_568;
  uVar11 = -(uint)(fVar19 <= fVar21);
  fVar22 = (float)local_158._0_4_ * local_9a0 + local_56c;
  fVar23 = (float)local_58._0_4_ * local_9a0 + local_568;
  uVar18 = -(uint)(fVar23 <= fVar22);
  fVar19 = ((float)(~uVar18 & (uint)fVar23 | (uint)fVar22 & uVar18) -
           (float)(~uVar11 & (uint)fVar21 | (uint)fVar19 & uVar11)) *
           (local_9a0 - (float)local_358._0_4_);
  fVar21 = (float)(~-(uint)(fVar19 < 1e-06) & (uint)(1.0 - local_9a4 / fVar19));
  fVar19 = 1.0;
  if (fVar21 <= 1.0) {
    fVar19 = fVar21;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,(string *)local_930,&local_908,&local_5a8,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar21 < 0.0) & (uint)(fVar19 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"SampleTemporalStability","")
  ;
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5e8,"Sample temporal stability","");
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"%","");
  fVar19 = (float)local_68._0_4_ * local_570 + local_580;
  fVar21 = (float)local_78._0_4_ * local_570 + local_57c;
  uVar11 = -(uint)(fVar19 <= fVar21);
  fVar22 = (float)local_68._0_4_ * local_574 + local_580;
  fVar23 = (float)local_78._0_4_ * local_574 + local_57c;
  uVar18 = -(uint)(fVar23 <= fVar22);
  fVar19 = ((float)(~uVar18 & (uint)fVar23 | (uint)fVar22 & uVar18) -
           (float)(~uVar11 & (uint)fVar21 | (uint)fVar19 & uVar11)) * (local_574 - local_570);
  fVar21 = (float)(~-(uint)(fVar19 < 1e-06) & (uint)(1.0 - local_578 / fVar19));
  fVar19 = 1.0;
  if (fVar21 <= 1.0) {
    fVar19 = fVar21;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_5c8,&local_5e8,&local_6d8,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar21 < 0.0) & (uint)(fVar19 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,"ApproximatedConstantCost","");
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_718,"Approximated contant cost","");
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_6f8,&local_718,&local_738,QP_KEY_TAG_TIME,local_814.offset);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_758,"ApproximatedConstantCostConfidence60Lower","");
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_778,"Approximated contant cost 60% confidence lower limit","");
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_650,&local_758,&local_778,&local_798,QP_KEY_TAG_TIME,
             local_814.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_650.m_name._M_dataplus._M_p,local_650.m_desc._M_dataplus._M_p,
             local_650.m_unit._M_dataplus._M_p,local_650.m_tag,local_650.m_value);
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b8,"ApproximatedConstantCostConfidence60Upper","");
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7d8,"Approximated contant cost 60% confidence upper limit","");
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_6b8,&local_7b8,&local_7d8,&local_7f8,QP_KEY_TAG_TIME,
             local_814.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_6b8.m_name._M_dataplus._M_p,local_6b8.m_desc._M_dataplus._M_p,
             local_6b8.m_unit._M_dataplus._M_p,local_6b8.m_tag,local_6b8.m_value);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"ApproximatedLinearCost","");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,"Approximated linear cost","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_560,&local_340,&local_178,&local_198,QP_KEY_TAG_TIME,
             local_814.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_560.m_name._M_dataplus._M_p,local_560.m_desc._M_dataplus._M_p,
             local_560.m_unit._M_dataplus._M_p,local_560.m_tag,local_560.m_value);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"ApproximatedLinearCostConfidence60Lower","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,"Approximated linear cost 60% confidence lower limit","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_8e8,&local_1b8,&local_1d8,&local_1f8,QP_KEY_TAG_TIME,
             local_814.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_8e8.m_name._M_dataplus._M_p,local_8e8.m_desc._M_dataplus._M_p,
             local_8e8.m_unit._M_dataplus._M_p,local_8e8.m_tag,local_8e8.m_value);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"ApproximatedLinearCostConfidence60Upper","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"Approximated linear cost 60% confidence upper limit","");
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_428,&local_218,&local_238,&local_258,QP_KEY_TAG_TIME,
             local_814.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_428.m_name._M_dataplus._M_p,local_428.m_desc._M_dataplus._M_p,
             local_428.m_unit._M_dataplus._M_p,local_428.m_tag,local_428.m_value);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"ApproximatedProcessRate","")
  ;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,"Approximated processing rate","");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"MB / s","");
  fVar19 = fVar20 / ((local_584 / 1000.0) / 1000.0);
  local_358 = ZEXT416((uint)fVar19);
  tcu::LogNumber<float>::LogNumber
            (&local_3c0,&local_278,&local_298,&local_2b8,QP_KEY_TAG_PERFORMANCE,
             fVar19 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_3c0.m_name._M_dataplus._M_p,local_3c0.m_desc._M_dataplus._M_p,
             local_3c0.m_unit._M_dataplus._M_p,local_3c0.m_tag,local_3c0.m_value);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,"ApproximatedProcessRateNoConstant","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,"Approximated processing rate without constant cost","");
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_880,&local_2d8,&local_2f8,&local_318,QP_KEY_TAG_PERFORMANCE,
             (fVar20 / ((local_588 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_880.m_name._M_dataplus._M_p,local_880.m_desc._M_dataplus._M_p,
             local_880.m_unit._M_dataplus._M_p,local_880.m_tag,local_880.m_value);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"SampleMedianTime","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Median sample time","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_4f8,&local_98,&local_b8,&local_d8,QP_KEY_TAG_TIME,
             (local_564 - (float)(int)local_48) * local_910 +
             local_90c * (1.0 - (local_564 - (float)(int)local_48)));
  tcu::TestLog::writeFloat
            (log,local_4f8.m_name._M_dataplus._M_p,local_4f8.m_desc._M_dataplus._M_p,
             local_4f8.m_unit._M_dataplus._M_p,local_4f8.m_tag,local_4f8.m_value);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"SampleMedianProcess","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Median processing rate","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"MB / s","");
  local_148._0_4_ = (float)local_148._0_4_ + local_99c;
  fVar19 = 0.0009765625;
  tcu::LogNumber<float>::LogNumber
            (&local_490,&local_f8,&local_118,&local_138,QP_KEY_TAG_PERFORMANCE,
             (float)local_148._0_4_ * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_490.m_name._M_dataplus._M_p,local_490.m_desc._M_dataplus._M_p,
             local_490.m_unit._M_dataplus._M_p,local_490.m_tag,local_490.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.m_unit._M_dataplus._M_p != &local_490.m_unit.field_2) {
    operator_delete(local_490.m_unit._M_dataplus._M_p,
                    local_490.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.m_desc._M_dataplus._M_p != &local_490.m_desc.field_2) {
    operator_delete(local_490.m_desc._M_dataplus._M_p,
                    local_490.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.m_name._M_dataplus._M_p != &local_490.m_name.field_2) {
    operator_delete(local_490.m_name._M_dataplus._M_p,
                    CONCAT26(local_490.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_490.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_490.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_490.m_name.field_2._M_local_buf[2],
                                                        local_490.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_unit._M_dataplus._M_p != &local_4f8.m_unit.field_2) {
    operator_delete(local_4f8.m_unit._M_dataplus._M_p,
                    local_4f8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_desc._M_dataplus._M_p != &local_4f8.m_desc.field_2) {
    operator_delete(local_4f8.m_desc._M_dataplus._M_p,
                    local_4f8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_name._M_dataplus._M_p != &local_4f8.m_name.field_2) {
    operator_delete(local_4f8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4f8.m_name.field_2._M_allocated_capacity._6_2_,
                             local_4f8.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_unit._M_dataplus._M_p != &local_880.m_unit.field_2) {
    operator_delete(local_880.m_unit._M_dataplus._M_p,
                    local_880.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_desc._M_dataplus._M_p != &local_880.m_desc.field_2) {
    operator_delete(local_880.m_desc._M_dataplus._M_p,
                    local_880.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_880.m_name.field_2._M_local_buf[6],
                                      local_880.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_unit._M_dataplus._M_p != &local_3c0.m_unit.field_2) {
    operator_delete(local_3c0.m_unit._M_dataplus._M_p,
                    local_3c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_desc._M_dataplus._M_p != &local_3c0.m_desc.field_2) {
    operator_delete(local_3c0.m_desc._M_dataplus._M_p,
                    local_3c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_name._M_dataplus._M_p != &local_3c0.m_name.field_2) {
    operator_delete(local_3c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.m_unit._M_dataplus._M_p != &local_428.m_unit.field_2) {
    operator_delete(local_428.m_unit._M_dataplus._M_p,
                    local_428.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.m_desc._M_dataplus._M_p != &local_428.m_desc.field_2) {
    operator_delete(local_428.m_desc._M_dataplus._M_p,
                    local_428.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.m_name._M_dataplus._M_p != &local_428.m_name.field_2) {
    operator_delete(local_428.m_name._M_dataplus._M_p,
                    (ulong)(local_428.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_unit._M_dataplus._M_p != &local_8e8.m_unit.field_2) {
    operator_delete(local_8e8.m_unit._M_dataplus._M_p,
                    local_8e8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_desc._M_dataplus._M_p != &local_8e8.m_desc.field_2) {
    operator_delete(local_8e8.m_desc._M_dataplus._M_p,
                    local_8e8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_name._M_dataplus._M_p != &local_8e8.m_name.field_2) {
    operator_delete(local_8e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8e8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8e8.m_name.field_2._M_local_buf[6],
                                      local_8e8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_unit._M_dataplus._M_p != &local_560.m_unit.field_2) {
    operator_delete(local_560.m_unit._M_dataplus._M_p,
                    local_560.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_desc._M_dataplus._M_p != &local_560.m_desc.field_2) {
    operator_delete(local_560.m_desc._M_dataplus._M_p,
                    local_560.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_name._M_dataplus._M_p != &local_560.m_name.field_2) {
    operator_delete(local_560.m_name._M_dataplus._M_p,
                    CONCAT53(local_560.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_560.m_name.field_2._M_local_buf[2],
                                      local_560.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_unit._M_dataplus._M_p != &local_6b8.m_unit.field_2) {
    operator_delete(local_6b8.m_unit._M_dataplus._M_p,
                    local_6b8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_desc._M_dataplus._M_p != &local_6b8.m_desc.field_2) {
    operator_delete(local_6b8.m_desc._M_dataplus._M_p,
                    local_6b8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.m_name._M_dataplus._M_p != &local_6b8.m_name.field_2) {
    operator_delete(local_6b8.m_name._M_dataplus._M_p,
                    local_6b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,
                    CONCAT53(local_7f8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_7f8.field_2._M_local_buf[2],
                                      local_7f8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,
                    CONCAT17(local_7b8.field_2._M_local_buf[7],
                             local_7b8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_unit._M_dataplus._M_p != &local_650.m_unit.field_2) {
    operator_delete(local_650.m_unit._M_dataplus._M_p,
                    local_650.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_desc._M_dataplus._M_p != &local_650.m_desc.field_2) {
    operator_delete(local_650.m_desc._M_dataplus._M_p,
                    local_650.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_name._M_dataplus._M_p != &local_650.m_name.field_2) {
    operator_delete(local_650.m_name._M_dataplus._M_p,
                    local_650.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,
                    CONCAT53(local_798.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_798.field_2._M_local_buf[2],
                                      local_798.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,
                    CONCAT17(local_778.field_2._M_local_buf[7],
                             local_778.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,
                    CONCAT53(local_738.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_738.field_2._M_local_buf[2],
                                      local_738.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,
                    CONCAT26(local_718.field_2._M_allocated_capacity._6_2_,
                             local_718.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,
                    CONCAT53(local_6d8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6d8.field_2._M_local_buf[2],
                                      local_6d8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,(ulong)(local_908.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._0_8_ != &local_920) {
    operator_delete((void *)local_930._0_8_,
                    CONCAT17(local_920._M_local_buf[7],local_920._M_allocated_capacity._0_7_) + 1);
  }
  tcu::TestLog::endSection(local_320.m_log);
  RVar24.renderRateAtRange = (float)local_358._0_4_;
  RVar24.renderRateMedian = (float)local_148._0_4_;
  RVar24.renderRateAtInfinity = fVar19;
  return RVar24;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}